

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall slang::SmallVector<slang::SourceBuffer,_4UL>::SmallVector(void *param_1)

{
  size_type in_stack_ffffffffffffffd8;
  SmallVectorBase<slang::SourceBuffer> *in_stack_ffffffffffffffe0;
  
  SmallVectorBase<slang::SourceBuffer>::SmallVectorBase
            ((SmallVectorBase<slang::SourceBuffer> *)param_1,4);
  SmallVectorBase<slang::SourceBuffer>::reserve(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }